

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::CalculateG2
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,NESTcalc *this,
          int verbosity)

{
  pointer pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  ostream *poVar6;
  RandomGen *pRVar7;
  int64_t iVar8;
  int64_t iVar9;
  VDetector *pVVar10;
  runtime_error *this_00;
  int iVar11;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double local_f8;
  double local_e8;
  bool YesGas;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  undefined1 local_a8 [16];
  double local_98;
  double local_90;
  vector<double,_std::allocator<double>_> *local_88;
  double local_80;
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_88 = __return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,5,(allocator_type *)&local_78);
  if (this->fdetector->inGas == false) {
    uVar12 = 0x71f8909d;
    uVar13 = 0x3ffd9010;
  }
  else {
    uVar12 = 0;
    uVar13 = 0x3ff00000;
  }
  local_a8._8_8_ = 0;
  local_a8._0_8_ = this->fdetector->E_gas;
  bVar5 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  uVar14 = local_a8._12_4_;
  dVar15 = local_a8._0_8_ / (double)CONCAT44(uVar13,uVar12);
  local_a8._8_4_ = local_a8._8_4_;
  local_a8._0_8_ = dVar15;
  local_a8._12_4_ = uVar14;
  if (bVar5) {
    dVar15 = pow(dVar15,1.3849);
    dVar15 = exp(dVar15 * -1.003);
    dVar15 = dVar15 * -1.1974 + 1.0;
  }
  else {
    dVar15 = this->fdetector->T_Kelvin;
    dVar18 = dVar15 * dVar15;
    dVar16 = pow(dVar15,3.0);
    dVar19 = pow(dVar15,4.0);
    local_b0 = dVar19 * 9.607626262594e-05 +
               dVar16 * -0.06692362929271 +
               dVar18 * 17.47197309338 + dVar15 * -2026.247730928 + 88075.2862664;
    dVar16 = pow(dVar15,3.0);
    dVar19 = pow(dVar15,4.0);
    dVar17 = pow(dVar15,5.0);
    dVar2 = pow(dVar15,3.0);
    dVar3 = pow(dVar15,4.0);
    dVar4 = pow(dVar15,5.0);
    local_e8 = -(dVar17 * -3.194249083426e-06 +
                dVar19 * 0.002778229721617 +
                dVar16 * -0.9663183204468 +
                dVar18 * 168.0089978382 + dVar15 * -14601.68019275 + 507480.0229635);
    dVar15 = pow((double)local_a8._0_8_,
                 dVar18 * -1602.830617076 + dVar15 * 136655.5237249 + -4659269.96412 +
                 dVar2 * 9.397480411915 + dVar3 * -0.02754232523872 + dVar4 * 3.228101180588e-05);
    dVar15 = exp(dVar15 * local_e8);
    dVar15 = 1.0 - dVar15 * local_b0;
  }
  pVVar10 = this->fdetector;
  if ((1.0 < dVar15) || (pVVar10->inGas == true)) {
    dVar15 = 1.0;
  }
  local_98 = pVVar10->anode - pVVar10->TopDrift;
  if ((0.0 < (double)local_a8._0_8_) && (local_98 <= 0.0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"\tERR: The gas gap in the S2 calculation broke!!!!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  YesGas = true;
  dVar16 = GetDensity(pVVar10->T_Kelvin,pVVar10->p_bar,&YesGas,1,pVVar10->molarMass);
  bVar5 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (bVar5) {
    uVar12 = 0x87548d16;
    uVar13 = 0x3c41863f;
  }
  else {
    uVar12 = 0xd68a42b6;
    uVar13 = 0x3c55acc7;
  }
  dVar19 = (double)CONCAT44(uVar13,uVar12);
  if (bVar5) {
    local_b8 = 0.0813;
  }
  else {
    local_b8 = 0.137;
  }
  pVVar10 = this->fdetector;
  local_b0 = (pVVar10->E_gas * local_b8 * 1000.0 +
             ((dVar16 * -6.0221409e+23) / pVVar10->molarMass) * dVar19) * local_98 * 0.1;
  if ((((double)local_a8._0_8_ != 0.0) || (NAN((double)local_a8._0_8_))) && (local_b0 <= 0.0)) {
    std::operator<<((ostream *)&std::cerr,"\tWARNING, the field in gas must be at least ");
    poVar6 = std::ostream::_M_insert<double>
                       ((dVar16 * dVar19 * 0.001 * 6.0221409e+23) /
                        (this->fdetector->molarMass * local_b8));
    poVar6 = std::operator<<(poVar6," kV/cm, for S2 to work,");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::operator<<((ostream *)&std::cerr,"\tOR: your density for gas must be less than ");
    poVar6 = std::ostream::_M_insert<double>
                       ((local_b8 * this->fdetector->molarMass * this->fdetector->E_gas * 1000.0) /
                        (dVar19 * 6.0221409e+23));
    poVar6 = std::operator<<(poVar6," g/cm^3.");
    std::endl<char,std::char_traits<char>>(poVar6);
    pVVar10 = this->fdetector;
  }
  local_c8 = pVVar10->g1_gas * local_b0;
  if (pVVar10->s2_thr <= 0.0 && pVVar10->s2_thr != 0.0) {
    (*pVVar10->_vptr_VDetector[7])(0,0,pVVar10->TopDrift * 0.5,&local_78);
    local_c8 = local_c8 * local_78._M_impl.super__Vector_impl_data._M_start[1];
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  }
  dVar16 = 0.0;
  if (0.0 <= dVar15) {
    dVar16 = dVar15;
  }
  local_a8._0_8_ = ~-(ulong)((double)local_a8._0_8_ <= 0.0) & (ulong)dVar16;
  local_a8._8_8_ = 0;
  local_80 = (double)local_a8._0_8_ * local_c8;
  if (verbosity < 1) {
    local_e8 = local_c8;
  }
  else {
    iVar11 = 10000;
    local_e8 = 0.0;
    local_b8 = 0.0;
    while( true ) {
      bVar5 = iVar11 == 0;
      iVar11 = iVar11 + -1;
      if (bVar5) break;
      pRVar7 = RandomGen::rndm();
      dVar15 = this->fdetector->s2Fano * local_b0;
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      dVar15 = RandomGen::rand_gauss(pRVar7,local_b0,dVar15,true);
      local_c0 = floor(dVar15 + 0.5);
      pRVar7 = RandomGen::rndm();
      dVar16 = RandomGen::rand_uniform(pRVar7);
      dVar15 = this->fdetector->radius;
      pRVar7 = RandomGen::rndm();
      dVar19 = RandomGen::rand_uniform(pRVar7);
      if (dVar19 < 0.0) {
        dVar19 = sqrt(dVar19);
      }
      else {
        dVar19 = SQRT(dVar19);
      }
      dVar15 = dVar15 * dVar19;
      local_90 = cos(dVar16 * 6.283185307179586);
      local_90 = local_90 * dVar15;
      dVar16 = sin(dVar16 * 6.283185307179586);
      (*this->fdetector->_vptr_VDetector[6])(SUB84(local_90,0),dVar15 * dVar16,this->fdetector,0);
      (*this->fdetector->_vptr_VDetector[6])(0,0,this->fdetector,0);
      pRVar7 = RandomGen::rndm();
      dVar16 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) /
               (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      iVar8 = RandomGen::binom_draw(pRVar7,(long)(int)local_c0,this->fdetector->g1_gas * dVar16);
      pRVar7 = RandomGen::rndm();
      iVar9 = RandomGen::binom_draw(pRVar7,(long)(int)iVar8,this->fdetector->P_dphe);
      pRVar7 = RandomGen::rndm();
      dVar19 = (double)(iVar9 + (int)iVar8);
      dVar15 = this->fdetector->sPEres;
      if (dVar19 < 0.0) {
        local_c0 = dVar15;
        dVar17 = sqrt(dVar19);
        dVar15 = local_c0;
      }
      else {
        dVar17 = SQRT(dVar19);
      }
      dVar19 = RandomGen::rand_gauss(pRVar7,dVar19,dVar15 * dVar17,true);
      dVar15 = this->fdetector->noiseQuadratic[1];
      if ((dVar15 != 0.0) || (NAN(dVar15))) {
        pRVar7 = RandomGen::rndm();
        dVar15 = this->fdetector->noiseQuadratic[1] * dVar19 * dVar19;
        dVar17 = this->fdetector->noiseLinear[1] * dVar19;
        dVar15 = SQRT(dVar17 * dVar17 + dVar15 * dVar15);
      }
      else {
        pRVar7 = RandomGen::rndm();
        dVar15 = this->fdetector->noiseLinear[1] * dVar19;
      }
      local_f8 = RandomGen::rand_gauss(pRVar7,dVar19,dVar15,true);
      pVVar10 = this->fdetector;
      if (pVVar10->s2_thr <= 0.0 && pVVar10->s2_thr != 0.0) {
        pRVar7 = RandomGen::rndm();
        (*this->fdetector->_vptr_VDetector[7])(0,0,this->fdetector->TopDrift * 0.5,&local_78);
        local_c0 = local_78._M_impl.super__Vector_impl_data._M_start[1] * local_f8;
        (*this->fdetector->_vptr_VDetector[7])(0,0,this->fdetector->TopDrift * 0.5,&local_48);
        local_90 = local_48._M_impl.super__Vector_impl_data._M_start[1];
        (*this->fdetector->_vptr_VDetector[7])(0,0,this->fdetector->TopDrift * 0.5,&local_60);
        dVar15 = (1.0 - local_60._M_impl.super__Vector_impl_data._M_start[1]) * local_f8 * local_90;
        if (dVar15 < 0.0) {
          dVar15 = sqrt(dVar15);
        }
        else {
          dVar15 = SQRT(dVar15);
        }
        local_f8 = RandomGen::rand_gauss(pRVar7,local_c0,dVar15,true);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
        pVVar10 = this->fdetector;
      }
      dVar16 = (local_f8 / dVar16) / (pVVar10->P_dphe + 1.0);
      dVar15 = local_c8 - dVar16;
      local_b8 = local_b8 + dVar15 * dVar15;
      local_e8 = local_e8 + dVar16;
    }
    if (local_b8 < 0.0) {
      dVar15 = sqrt(local_b8);
    }
    else {
      dVar15 = SQRT(local_b8);
    }
    poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<(poVar6,"g1 = ");
    poVar6 = std::ostream::_M_insert<double>(this->fdetector->g1);
    std::operator<<(poVar6," phd per photon\tg2 = ");
    poVar6 = std::ostream::_M_insert<double>(local_80);
    std::operator<<(poVar6," phd per electron (e-EE = ");
    poVar6 = std::ostream::_M_insert<double>((double)local_a8._0_8_ * 100.0);
    std::operator<<(poVar6,"%, SE_mean,width = ");
    local_e8 = local_e8 / 10000.0;
    poVar6 = std::ostream::_M_insert<double>(local_e8);
    std::operator<<(poVar6,",");
    poVar6 = std::ostream::_M_insert<double>(dVar15 / 99.99499987499375);
    std::operator<<(poVar6,")\t");
  }
  pdVar1 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar1 = local_b0;
  pdVar1[1] = (double)local_a8._0_8_;
  pdVar1[2] = local_e8;
  pdVar1[3] = local_80;
  pdVar1[4] = local_98;
  return local_88;
}

Assistant:

vector<double> NESTcalc::CalculateG2(int verbosity) {
  vector<double> g2_params(5);

  // Set parameters for calculating EL yield and extraction
  double alpha = 0.137, beta = 4.70e-18,
         gamma = 0;  // note the value of alpha is similar to ~1/7eV. Not
                     // coincidence. Noted in Mock et al.
  // actually listed as 'a' and 'b' in ref (below). Units 1/V, cm^2
  double epsilonRatio = EPS_LIQ / std::abs(EPS_GAS);
  if (fdetector->get_inGas())
    epsilonRatio = 1.;  // in an all-gas detector, E_liq variable below simply
  // becomes the field value between anode and gate

  // Convert gas extraction field to liquid field
  double E_liq = fdetector->get_E_gas() / epsilonRatio;  // kV per cm
  double ExtEff;
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.))  // Argon
    ExtEff =
        1. - 1.1974 * exp(-1.003 *
                          pow(E_liq, 1.3849));  // Guschin 1978-79 and 1981-82
  else {
    if (EPS_GAS < 0.) {
      ExtEff =
          1. -
          exp(-0.12172 *
              pow(E_liq, 2.0691));  // Columbia and PandaX: much higher than
                                    // everyone else, so tucked away as optional
    } else {
      double T_Kelvin =
          fdetector->get_T_Kelvin();  // data was available at 160(solid), 165,
                                      // 170, 173, 175, 177, 179, 181 K (can't
                                      // find PandaX)
      double em1 = 8.807528626640e4 - 2.026247730928e3 * T_Kelvin +
                   1.747197309338e1 * pow(T_Kelvin, 2.) -
                   6.692362929271e-2 * pow(T_Kelvin, 3.) +
                   9.607626262594e-5 * pow(T_Kelvin, 4.);  // ~1
      double em2 = 5.074800229635e5 -                      // ~0.05
                   1.460168019275e4 * T_Kelvin +
                   1.680089978382e2 * pow(T_Kelvin, 2.) -
                   9.663183204468e-1 * pow(T_Kelvin, 3.) +
                   2.778229721617e-3 * pow(T_Kelvin, 4.) -
                   3.194249083426e-6 * pow(T_Kelvin, 5.);
      double em3 = -4.659269964120e6 +  // ~1-5
                   1.366555237249e5 * T_Kelvin -
                   1.602830617076e3 * pow(T_Kelvin, 2.) +
                   9.397480411915e-0 * pow(T_Kelvin, 3.) -
                   2.754232523872e-2 * pow(T_Kelvin, 4.) +
                   3.228101180588e-5 * pow(T_Kelvin, 5.);
      ExtEff =
          1. -
          em1 * exp(-em2 *
                    pow(E_liq,
                        em3));  // combination of GusX4 (RED fav), PIXeY,
                                // LUX Run03, LLNLx2, LUX Run04, XENON10,100
    }
  }
  if (ExtEff > 1. || fdetector->get_inGas()) ExtEff = 1.;
  if (ExtEff < 0. || E_liq <= 0.) ExtEff = 0.;

  double gasGap =
      fdetector->get_anode() -
      fdetector
          ->get_TopDrift();  // EL gap in mm -> cm, affecting S2 size linearly
  if (gasGap <= 0. && E_liq > 0.) {
    throw std::runtime_error(
        "\tERR: The gas gap in the S2 calculation broke!!!!");
  }

  // Calculate EL yield based on gas gap, extraction field, and pressure
  // double elYield = (alpha * fdetector->get_E_gas() * 1e3 -
  //                beta * fdetector->get_p_bar() - gamma) *
  //               gasGap * 0.1;  // arXiv:1207.2292 (HA, Vitaly C.)
  bool YesGas = true;
  double rho = GetDensity(fdetector->get_T_Kelvin(), fdetector->get_p_bar(),
                          YesGas, 1, fdetector->get_molarMass());
  double elYield;
  if (ValidityTests::nearlyEqual(
          ATOM_NUM, 18.)) {  // Henrique Araujo and Vitaly Chepel again
    alpha = 0.0813;
    beta = 1.90e-18;
  }
  elYield = (alpha * fdetector->get_E_gas() * 1e3 -
             beta * (NEST_AVO * rho / fdetector->get_molarMass())) *
            gasGap * 0.1;
  // replaced with more accurate version also from 1207.2292, but works for room
  // temperature gas
  if (elYield <= 0.0 && E_liq != 0.) {
    cerr << "\tWARNING, the field in gas must be at least "
         << 1e-3 * beta * NEST_AVO * rho / (alpha * fdetector->get_molarMass())
         << " kV/cm, for S2 to work," << endl;
    cerr << "\tOR: your density for gas must be less than "
         << fdetector->get_molarMass() * alpha * fdetector->get_E_gas() * 1e3 /
                (beta * NEST_AVO)
         << " g/cm^3." << endl;
  }
  // Calculate single electron size and then g2
  double SE = elYield * fdetector->get_g1_gas();  // multiplying by light
  // collection efficiency in
  // the gas gap
  if (fdetector->get_s2_thr() < 0)
    SE *= fdetector->FitTBA(0., 0., fdetector->get_TopDrift() / 2.)[1];
  double g2 = ExtEff * SE;
  double StdDev = 0., Nphe, pulseArea, pulseAreaC, NphdC, phi, posDep, r, x, y;
  int Nph, nHits, numSE = 10000;
  if (verbosity > 0) {
    double muSE = 0.;
    for (int i = 0; i < numSE; ++i) {
      // calculate properly the width (1-sigma std dev) in the SE size
      Nph = int(
          floor(RandomGen::rndm()->rand_gauss(
                    elYield, sqrt(fdetector->get_s2Fano() * elYield), true) +
                0.5));
      phi = two_PI * RandomGen::rndm()->rand_uniform();
      r = fdetector->get_radius() * sqrt(RandomGen::rndm()->rand_uniform());
      x = r * cos(phi);
      y = r * sin(phi);
      posDep = fdetector->FitS2(x, y, VDetector::fold) /
               fdetector->FitS2(
                   0., 0., VDetector::fold);  // future upgrade: smeared pos
      nHits =
          RandomGen::rndm()->binom_draw(Nph, fdetector->get_g1_gas() * posDep);
      Nphe =
          nHits + RandomGen::rndm()->binom_draw(nHits, fdetector->get_P_dphe());
      pulseArea = RandomGen::rndm()->rand_gauss(
          Nphe, fdetector->get_sPEres() * sqrt(Nphe), true);
      if (fdetector->get_noiseQuadratic()[1] != 0) {
        pulseArea = RandomGen::rndm()->rand_gauss(
            pulseArea,
            sqrt(
                pow(fdetector->get_noiseQuadratic()[1] * pow(pulseArea, 2), 2) +
                pow(fdetector->get_noiseLinear()[1] * pulseArea, 2)),
            true);
      } else {
        pulseArea = RandomGen::rndm()->rand_gauss(
            pulseArea, fdetector->get_noiseLinear()[1] * pulseArea, true);
      }
      if (fdetector->get_s2_thr() < 0.)
        pulseArea = RandomGen::rndm()->rand_gauss(
            fdetector->FitTBA(0.0, 0.0, fdetector->get_TopDrift() / 2.)[1] *
                pulseArea,
            sqrt(
                fdetector->FitTBA(0.0, 0.0, fdetector->get_TopDrift() / 2.)[1] *
                pulseArea *
                (1. - fdetector->FitTBA(0.0, 0.0,
                                        fdetector->get_TopDrift() / 2.)[1])),
            true);
      pulseAreaC = pulseArea / posDep;
      NphdC = pulseAreaC / (1. + fdetector->get_P_dphe());
      StdDev += (SE - NphdC) * (SE - NphdC);
      muSE += NphdC;
    }
    SE = muSE / double(numSE);
    StdDev =
        sqrt(StdDev) / sqrt(double(numSE) - 1.);  // N-1 from above (10,000)

    cout << endl
         << "g1 = " << fdetector->get_g1() << " phd per photon\tg2 = " << g2
         << " phd per electron (e-EE = ";
    cout << ExtEff * 100. << "%, SE_mean,width = " << SE << "," << StdDev
         << ")\t";
  }

  // Store the g2 parameters in a vector for later (calculated once per
  // detector)
  g2_params[0] = elYield;
  g2_params[1] = ExtEff;
  g2_params[2] = SE;
  g2_params[3] = g2;
  g2_params[4] = gasGap;
  return g2_params;
}